

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verification_utils.hpp
# Opt level: O0

void __thiscall
boost::certify::store_ctx::store_ctx
          (store_ctx *this,certificate_chain *chain,certificate_store *store)

{
  error_code ec_00;
  error_code ec_01;
  X509 *x509;
  bool bVar1;
  X509_STORE_CTX *pXVar2;
  native_handle_type psVar3;
  OPENSSL_STACK *pOVar4;
  X509_STORE *store_00;
  ulong uVar5;
  error_category *peVar6;
  system_error local_108;
  error_code local_c8;
  int local_b4;
  X509 *pXStack_b0;
  int ret;
  X509 *cert;
  error_category *peStack_a0;
  system_error local_98;
  X509 *local_48;
  error_category *peStack_40;
  X509 *pXStack_38;
  error_code ec;
  certificate_store *store_local;
  certificate_chain *chain_local;
  store_ctx *this_local;
  
  pXVar2 = X509_STORE_CTX_new();
  std::unique_ptr<x509_store_ctx_st,boost::certify::store_ctx::free>::
  unique_ptr<boost::certify::store_ctx::free,void>
            ((unique_ptr<x509_store_ctx_st,boost::certify::store_ctx::free> *)this,(pointer)pXVar2);
  system::error_code::error_code((error_code *)&pXStack_38);
  bVar1 = std::operator==(&this->handle_,(nullptr_t)0x0);
  if (bVar1) {
    uVar5 = ERR_get_error();
    peVar6 = asio::error::get_ssl_category();
    system::error_code::error_code((error_code *)&local_48,(int)uVar5,peVar6);
    pXStack_38 = local_48;
    ec._0_8_ = peStack_40;
    cert = local_48;
    peStack_a0 = peStack_40;
    ec_01.cat_ = peStack_40;
    ec_01._0_8_ = local_48;
    system::system_error::system_error(&local_98,ec_01);
    throw_exception<boost::system::system_error>(&local_98);
  }
  psVar3 = certificate_chain::native_handle(chain);
  pOVar4 = ossl_check_const_X509_sk_type(psVar3);
  pXStack_b0 = (X509 *)OPENSSL_sk_value(pOVar4,0);
  pXVar2 = (X509_STORE_CTX *)
           std::unique_ptr<x509_store_ctx_st,_boost::certify::store_ctx::free>::get(&this->handle_);
  store_00 = (X509_STORE *)certificate_store::native_handle(store);
  x509 = pXStack_b0;
  psVar3 = certificate_chain::native_handle(chain);
  local_b4 = X509_STORE_CTX_init(pXVar2,store_00,x509,(stack_st_X509 *)psVar3);
  if (local_b4 != 1) {
    uVar5 = ERR_get_error();
    peVar6 = asio::error::get_ssl_category();
    system::error_code::error_code(&local_c8,(int)uVar5,peVar6);
    pXStack_38 = (X509 *)local_c8._0_8_;
    ec._0_8_ = local_c8.cat_;
    ec_00.cat_ = local_c8.cat_;
    ec_00.val_ = local_c8.val_;
    ec_00.failed_ = local_c8.failed_;
    ec_00._5_3_ = local_c8._5_3_;
    system::system_error::system_error(&local_108,ec_00);
    throw_exception<boost::system::system_error>(&local_108);
  }
  pXVar2 = (X509_STORE_CTX *)
           std::unique_ptr<x509_store_ctx_st,_boost::certify::store_ctx::free>::get(&this->handle_);
  X509_STORE_CTX_set_verify_cb(pXVar2,verify_server_certificates);
  return;
}

Assistant:

explicit store_ctx(certificate_chain& chain, certificate_store& store)
      : handle_{::X509_STORE_CTX_new()}
    {
        system::error_code ec;
        if (handle_ == nullptr)
        {
            ec = {static_cast<int>(::ERR_get_error()),
                  boost::asio::error::get_ssl_category()};
            boost::throw_exception(system::system_error{ec});
        }

        X509* const cert = sk_X509_value(chain.native_handle(), 0);
        auto const ret = ::X509_STORE_CTX_init(
          handle_.get(), store.native_handle(), cert, chain.native_handle());
        if (ret != 1)
        {

            ec = {static_cast<int>(::ERR_get_error()),
                  boost::asio::error::get_ssl_category()};
            boost::throw_exception(system::system_error{ec});
        }
        ::X509_STORE_CTX_set_verify_cb(handle_.get(),
                                       &detail::verify_server_certificates);
    }